

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.hpp
# Opt level: O0

void __thiscall OpenMD::NPA::~NPA(NPA *this)

{
  NPA *in_RDI;
  
  ~NPA(in_RDI);
  operator_delete(in_RDI,0x328);
  return;
}

Assistant:

NPA(SimInfo* info) : NPT(info) {}